

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O3

int rtr_undo_update_pfx_table_batch
              (rtr_socket *rtr_socket,pfx_table *pfx_table,pdu_ipv4 *ipv4_pdus,size_t ipv4_pdu_count
              ,pdu_ipv6 *ipv6_pdus,size_t ipv6_pdu_count)

{
  long lVar1;
  int iVar2;
  int iVar3;
  pdu_ipv6 *pdu;
  ulong uVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (ipv4_pdu_count != 0) {
    do {
      iVar2 = rtr_undo_update_pfx_table(rtr_socket,pfx_table,ipv4_pdus);
      if (iVar2 == -1) goto LAB_0010bf85;
      ipv4_pdus = ipv4_pdus + 1;
      ipv4_pdu_count = ipv4_pdu_count - 1;
    } while (ipv4_pdu_count != 0);
  }
  if (ipv6_pdu_count == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = rtr_undo_update_pfx_table(rtr_socket,pfx_table,ipv6_pdus);
    if (iVar2 == -1) {
LAB_0010bf85:
      iVar2 = -1;
    }
    else {
      pdu = ipv6_pdus + 1;
      iVar2 = 0;
      uVar4 = 0;
      do {
        if (ipv6_pdu_count - 1 == uVar4) goto LAB_0010bfa9;
        iVar3 = rtr_undo_update_pfx_table(rtr_socket,pfx_table,pdu);
        pdu = pdu + 1;
        uVar4 = uVar4 + 1;
      } while (iVar3 != -1);
      iVar2 = -(uint)(uVar4 < ipv6_pdu_count);
    }
    lrtr_dbg(
            "RTR Socket: Couldn\'t undo all update operations from failed data synchronisation: Purging all prefix records"
            );
    pfx_table_src_remove(pfx_table,rtr_socket);
  }
LAB_0010bfa9:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

static int rtr_undo_update_pfx_table_batch(struct rtr_socket *rtr_socket, struct pfx_table *pfx_table,
					   struct pdu_ipv4 *ipv4_pdus, size_t ipv4_pdu_count,
					   struct pdu_ipv6 *ipv6_pdus, size_t ipv6_pdu_count)
{
	for (size_t i = 0; i < ipv4_pdu_count; i++) {
		int res = rtr_undo_update_pfx_table(rtr_socket, pfx_table, &(ipv4_pdus[i]));

		if (res == RTR_ERROR || res == PFX_ERROR) {
			// Undo failed, cannot recover, remove all records associated with the socket instead
			RTR_DBG1(
				"Couldn't undo all update operations from failed data synchronisation: Purging all prefix records");
			pfx_table_src_remove(pfx_table, rtr_socket);
			return RTR_ERROR;
		}
	}

	for (size_t i = 0; i < ipv6_pdu_count; i++) {
		int res = rtr_undo_update_pfx_table(rtr_socket, pfx_table, &(ipv6_pdus[i]));

		if (res == RTR_ERROR || res == PFX_ERROR) {
			// Undo failed, cannot recover, remove all records associated with the socket instead
			RTR_DBG1(
				"Couldn't undo all update operations from failed data synchronisation: Purging all prefix records");
			pfx_table_src_remove(pfx_table, rtr_socket);
			return RTR_ERROR;
		}
	}
	return RTR_SUCCESS;
}